

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

FlagRegistry * gflags::anon_unknown_2::FlagRegistry::GlobalRegistry(void)

{
  int iVar1;
  FlagRegistry *pFVar2;
  MutexLock local_20;
  MutexLock acquire_lock;
  
  if ((anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock);
    if (iVar1 != 0) {
      gflags_mutex_namespace::Mutex::Mutex(&GlobalRegistry::lock,LINKER_INITIALIZED);
      __cxa_atexit(gflags_mutex_namespace::Mutex::~Mutex,&GlobalRegistry::lock,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock);
    }
  }
  gflags_mutex_namespace::MutexLock::MutexLock(&local_20,&GlobalRegistry::lock);
  if ((anonymous_namespace)::FlagRegistry::global_registry_ == (FlagRegistry *)0x0) {
    pFVar2 = (FlagRegistry *)operator_new(0x68);
    FlagRegistry(pFVar2);
    (anonymous_namespace)::FlagRegistry::global_registry_ = pFVar2;
  }
  pFVar2 = (anonymous_namespace)::FlagRegistry::global_registry_;
  gflags_mutex_namespace::MutexLock::~MutexLock(&local_20);
  return pFVar2;
}

Assistant:

FlagRegistry* FlagRegistry::GlobalRegistry() {
  static Mutex lock(Mutex::LINKER_INITIALIZED);
  MutexLock acquire_lock(&lock);
  if (!global_registry_) {
    global_registry_ = new FlagRegistry;
  }
  return global_registry_;
}